

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verilogAST.hpp
# Opt level: O0

void __thiscall verilogAST::SingleLineComment::~SingleLineComment(SingleLineComment *this)

{
  SingleLineComment *this_local;
  
  *(undefined ***)this = &PTR_toString_abi_cxx11__0031d8a8;
  *(undefined **)&this->super_BehavioralStatement = &DAT_0031d8d0;
  std::unique_ptr<verilogAST::Statement,_std::default_delete<verilogAST::Statement>_>::~unique_ptr
            (&this->statement);
  std::__cxx11::string::~string((string *)&this->value);
  BehavioralStatement::~BehavioralStatement(&this->super_BehavioralStatement);
  StructuralStatement::~StructuralStatement(&this->super_StructuralStatement);
  return;
}

Assistant:

~SingleLineComment(){}